

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::write_significand<char*,char>
                 (char *out,char *significand,int significand_size,int integral_size,
                 char decimal_point)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  char in_R8B;
  undefined7 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = copy_str<char,_const_char_*,_char_*,_0>
                      ((char *)CONCAT44(in_EDX,in_ECX),
                       (char *)CONCAT17(in_R8B,in_stack_ffffffffffffffd8),(char *)0x149e19);
  if (in_R8B != '\0') {
    *local_8 = in_R8B;
    local_8 = copy_str<char,_const_char_*,_char_*,_0>
                        ((char *)CONCAT44(in_EDX,in_ECX),
                         (char *)CONCAT17(in_R8B,in_stack_ffffffffffffffd8),(char *)0x149e6c);
  }
  return local_8;
}

Assistant:

inline OutputIt write_significand(OutputIt out, const char* significand,
                                  int significand_size, int integral_size,
                                  Char decimal_point) {
  out = detail::copy_str<Char>(significand, significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str<Char>(significand + integral_size,
                                significand + significand_size, out);
}